

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t k,real threshold,int32_t node,real score,
          Predictions *heap,Vector *hidden)

{
  pointer *pppVar1;
  int32_t node_00;
  pointer ppVar2;
  pointer pNVar3;
  element_type *peVar4;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __first;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  float fVar8;
  real rVar9;
  undefined1 auVar10 [64];
  float local_4c;
  pair<float,_int> local_38;
  undefined1 extraout_var [60];
  
  local_4c = score;
  while( true ) {
    auVar10._0_4_ = std_log(threshold);
    auVar10._4_60_ = extraout_var;
    auVar7 = auVar10._0_16_;
    if (local_4c < auVar10._0_4_) {
      return;
    }
    ppVar2 = (heap->
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (((long)(heap->
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3 == (long)k) &&
       (fVar8 = ppVar2->first, auVar7 = ZEXT416((uint)fVar8), local_4c < fVar8)) break;
    lVar6 = (long)node;
    pNVar3 = (this->tree_).
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pNVar3[lVar6].left == -1) && (pNVar3[lVar6].right == -1)) {
      local_38.first = local_4c;
      local_38.second = node;
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<std::pair<float,int>>
                ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38
                );
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
                 (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish,comparePairs);
      __first._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if ((ulong)((long)__last._M_current - (long)__first._M_current >> 3) <= (ulong)(long)k) {
        return;
      }
      std::
      pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                (__first,__last,comparePairs);
      pppVar1 = &(heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + -1;
      return;
    }
    peVar4 = (((this->super_BinaryLogisticLoss).super_Loss.wo_)->
             super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar4->_vptr_Matrix[2])(peVar4,hidden,lVar6 - this->osz_);
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(auVar7,auVar5);
    fVar8 = expf(auVar7._0_4_);
    fVar8 = 1.0 / (fVar8 + 1.0);
    node_00 = (this->tree_).
              super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar6].left;
    rVar9 = std_log(1.0 - fVar8);
    dfs(this,k,threshold,node_00,rVar9 + local_4c,heap,hidden);
    node = (this->tree_).
           super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar6].right;
    rVar9 = std_log(fVar8);
    local_4c = local_4c + rVar9;
  }
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t k,
    real threshold,
    int32_t node,
    real score,
    Predictions& heap,
    const Vector& hidden) const {
  if (score < std_log(threshold)) {
    return;
  }
  if (heap.size() == k && score < heap.front().first) {
    return;
  }

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    heap.push_back(std::make_pair(score, node));
    std::push_heap(heap.begin(), heap.end(), comparePairs);
    if (heap.size() > k) {
      std::pop_heap(heap.begin(), heap.end(), comparePairs);
      heap.pop_back();
    }
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(k, threshold, tree_[node].left, score + std_log(1.0 - f), heap, hidden);
  dfs(k, threshold, tree_[node].right, score + std_log(f), heap, hidden);
}